

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ivyFastMap.c
# Opt level: O0

int Ivy_FastMapDelay(Ivy_Man_t *pAig)

{
  int iVar1;
  Ivy_Obj_t *pIVar2;
  Ivy_Supp_t *pIVar3;
  int local_28;
  int local_24;
  int DelayMax;
  int i;
  Ivy_Obj_t *pObj;
  Ivy_Supp_t *pSupp;
  Ivy_Man_t *pAig_local;
  
  local_28 = 0;
  for (local_24 = 0; iVar1 = Vec_PtrSize(pAig->vPos), local_24 < iVar1; local_24 = local_24 + 1) {
    pIVar2 = (Ivy_Obj_t *)Vec_PtrEntry(pAig->vPos,local_24);
    pIVar2 = Ivy_ObjFanin0(pIVar2);
    iVar1 = Ivy_ObjIsNode(pIVar2);
    if ((iVar1 != 0) && (pIVar3 = Ivy_ObjSupp(pAig,pIVar2), local_28 < pIVar3->Delay)) {
      local_28 = (int)pIVar3->Delay;
    }
  }
  return local_28;
}

Assistant:

int Ivy_FastMapDelay( Ivy_Man_t * pAig )
{
    Ivy_Supp_t * pSupp;
    Ivy_Obj_t * pObj;
    int i, DelayMax = 0;
    Ivy_ManForEachPo( pAig, pObj, i )
    {
        pObj = Ivy_ObjFanin0(pObj);
        if ( !Ivy_ObjIsNode(pObj) )
            continue;
        pSupp = Ivy_ObjSupp( pAig, pObj );
        if ( DelayMax < pSupp->Delay )
            DelayMax = pSupp->Delay;
    }
    return DelayMax;
}